

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_output_auth(connectdata *conn,char *request,char *path,_Bool proxytunnel)

{
  auth *authstatus;
  auth *authstatus_00;
  _Bool _Var1;
  Curl_easy *pCVar2;
  unsigned_long uVar3;
  char *first;
  CURLcode CVar4;
  int iVar5;
  
  pCVar2 = conn->data;
  _Var1 = (conn->bits).httpproxy;
  if ((((_Var1 == true) && ((conn->bits).proxy_user_passwd != false)) ||
      ((conn->bits).user_passwd != false)) || (conn->oauth_bearer != (char *)0x0)) {
    authstatus = &(pCVar2->state).authhost;
    authstatus_00 = &(pCVar2->state).authproxy;
    uVar3 = authstatus->want;
    if ((uVar3 != 0) && ((pCVar2->state).authhost.picked == 0)) {
      (pCVar2->state).authhost.picked = uVar3;
    }
    uVar3 = authstatus_00->want;
    if ((uVar3 != 0) && ((pCVar2->state).authproxy.picked == 0)) {
      (pCVar2->state).authproxy.picked = uVar3;
    }
    if ((_Var1 == false) || ((conn->bits).tunnel_proxy != proxytunnel)) {
      (pCVar2->state).authproxy.done = true;
    }
    else {
      CVar4 = output_auth_headers(conn,authstatus_00,request,path,true);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
    if (((((pCVar2->state).this_is_a_follow != true) || ((conn->bits).netrc != false)) ||
        (first = (pCVar2->state).first_host, first == (char *)0x0)) ||
       (((pCVar2->set).allow_auth_to_other_hosts != false ||
        (iVar5 = Curl_strcasecompare(first,(conn->host).name), iVar5 != 0)))) {
      CVar4 = output_auth_headers(conn,authstatus,request,path,false);
      return CVar4;
    }
    (pCVar2->state).authhost.done = true;
  }
  else {
    (pCVar2->state).authhost.done = true;
    (pCVar2->state).authproxy.done = true;
  }
  return CURLE_OK;
}

Assistant:

CURLcode
Curl_http_output_auth(struct connectdata *conn,
                      const char *request,
                      const char *path,
                      bool proxytunnel) /* TRUE if this is the request setting
                                           up the proxy tunnel */
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct auth *authhost;
  struct auth *authproxy;

  DEBUGASSERT(data);

  authhost = &data->state.authhost;
  authproxy = &data->state.authproxy;

  if((conn->bits.httpproxy && conn->bits.proxy_user_passwd) ||
     conn->bits.user_passwd || conn->oauth_bearer)
    /* continue please */;
  else {
    authhost->done = TRUE;
    authproxy->done = TRUE;
    return CURLE_OK; /* no authentication with no user or password */
  }

  if(authhost->want && !authhost->picked)
    /* The app has selected one or more methods, but none has been picked
       so far by a server round-trip. Then we set the picked one to the
       want one, and if this is one single bit it'll be used instantly. */
    authhost->picked = authhost->want;

  if(authproxy->want && !authproxy->picked)
    /* The app has selected one or more methods, but none has been picked so
       far by a proxy round-trip. Then we set the picked one to the want one,
       and if this is one single bit it'll be used instantly. */
    authproxy->picked = authproxy->want;

#ifndef CURL_DISABLE_PROXY
  /* Send proxy authentication header if needed */
  if(conn->bits.httpproxy &&
      (conn->bits.tunnel_proxy == proxytunnel)) {
    result = output_auth_headers(conn, authproxy, request, path, TRUE);
    if(result)
      return result;
  }
  else
#else
  (void)proxytunnel;
#endif /* CURL_DISABLE_PROXY */
    /* we have no proxy so let's pretend we're done authenticating
       with it */
    authproxy->done = TRUE;

  /* To prevent the user+password to get sent to other than the original
     host due to a location-follow, we do some weirdo checks here */
  if(!data->state.this_is_a_follow ||
     conn->bits.netrc ||
     !data->state.first_host ||
     data->set.allow_auth_to_other_hosts ||
     strcasecompare(data->state.first_host, conn->host.name)) {
    result = output_auth_headers(conn, authhost, request, path, FALSE);
  }
  else
    authhost->done = TRUE;

  return result;
}